

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32_c_api_tests.c
# Opt level: O2

void decode_and_encode_c1_minimalExample_producesSameResult(void)

{
  bech32_error bVar1;
  int iVar2;
  bech32_DecodedResult *decodedResult;
  bech32_bstring *bstring;
  char bstr [9];
  char local_20 [16];
  
  builtin_strncpy(local_20,"a12uel5l",9);
  decodedResult = bech32_create_DecodedResult(local_20);
  bVar1 = bech32_decode(decodedResult,local_20);
  if (bVar1 != E_BECH32_SUCCESS) {
    __assert_fail("bech32_decode(decodedResult, bstr) == E_BECH32_SUCCESS",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                  ,0x1aa,"void decode_and_encode_c1_minimalExample_producesSameResult(void)");
  }
  if ((*decodedResult->hrp != 'a') || (decodedResult->hrp[1] != '\0')) {
    __assert_fail("strcmp(decodedResult->hrp, expectedHrp) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                  ,0x1ab,"void decode_and_encode_c1_minimalExample_producesSameResult(void)");
  }
  if (decodedResult->dplen != 0) {
    __assert_fail("decodedResult->dplen == expectedDpSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                  ,0x1ac,"void decode_and_encode_c1_minimalExample_producesSameResult(void)");
  }
  if (decodedResult->encoding == ENCODING_BECH32) {
    bstring = bech32_create_bstring(decodedResult->hrplen,0);
    bVar1 = bech32_encode_using_original_constant
                      (bstring,decodedResult->hrp,decodedResult->dp,decodedResult->dplen);
    if (bVar1 != E_BECH32_SUCCESS) {
      __assert_fail("bech32_encode_using_original_constant(bstring, decodedResult->hrp, decodedResult->dp, decodedResult->dplen) == E_BECH32_SUCCESS"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                    ,0x1b1,"void decode_and_encode_c1_minimalExample_producesSameResult(void)");
    }
    iVar2 = strcmp(local_20,bstring->string);
    if (iVar2 == 0) {
      bech32_free_DecodedResult(decodedResult);
      bech32_free_bstring(bstring);
      return;
    }
    __assert_fail("strcmp(bstr, bstring->string) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                  ,0x1b2,"void decode_and_encode_c1_minimalExample_producesSameResult(void)");
  }
  __assert_fail("ENCODING_BECH32 == decodedResult->encoding",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                ,0x1ad,"void decode_and_encode_c1_minimalExample_producesSameResult(void)");
}

Assistant:

void decode_and_encode_c1_minimalExample_producesSameResult(void) {
    char bstr[] = "a12uel5l";
    char expectedHrp[] = "a";
    const size_t expectedDpSize = 0; // 0 = num chars after '1', minus 6 for checksum chars

    bech32_DecodedResult * decodedResult = bech32_create_DecodedResult(bstr);

    assert(bech32_decode(decodedResult, bstr) == E_BECH32_SUCCESS);
    assert(strcmp(decodedResult->hrp, expectedHrp) == 0);
    assert(decodedResult->dplen == expectedDpSize);
    assert(ENCODING_BECH32 == decodedResult->encoding);

    bech32_bstring *bstring = bech32_create_bstring(decodedResult->hrplen, decodedResult->dplen);

    assert(bech32_encode_using_original_constant(bstring, decodedResult->hrp, decodedResult->dp, decodedResult->dplen) == E_BECH32_SUCCESS);
    assert(strcmp(bstr, bstring->string) == 0);

    bech32_free_DecodedResult(decodedResult);
    bech32_free_bstring(bstring);
}